

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O0

bool __thiscall banksia::WbEngine::engineMove(WbEngine *this,string *moveString,bool mustSend)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  byte in_DL;
  ulong in_RSI;
  GameTimeController *in_RDI;
  double dVar5;
  Move MVar6;
  Move MVar7;
  EngineComputingState oldComputingState;
  double period;
  Move move;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  moveRecv;
  GameTimeController *timeCtrl;
  string *in_stack_000001b8;
  ChessBoard *in_stack_000001c0;
  nullptr_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  PieceType in_stack_ffffffffffffff34;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff44;
  bool local_1;
  
  uVar3 = std::__cxx11::string::length();
  if (1 < uVar3) {
    pcVar4 = (char *)std::__cxx11::string::at(in_RSI);
    iVar2 = isalpha((int)*pcVar4);
    if ((iVar2 != 0) && (*(int *)((long)in_RDI[2].timeLeft + 0xc) == 1)) {
      dVar5 = in_RDI[2].lastQueryConsumed;
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::function((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                  *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      if ((dVar5 == 0.0) ||
         (bVar1 = std::operator==((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                                   *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                  in_stack_ffffffffffffff28), bVar1)) {
        local_1 = false;
      }
      else {
        MVar6 = BoardCore::moveFromCoordiateString((string *)in_RDI);
        bVar1 = Move::isValid((Move *)0x1e5a6c);
        MVar7.promotion = in_stack_ffffffffffffff34;
        MVar7._0_8_ = in_stack_ffffffffffffff38;
        uVar8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff40);
        if (!bVar1) {
          MVar7 = ChessBoard::fromSanString(in_stack_000001c0,in_stack_000001b8);
        }
        if ((in_DL & 1) == 0) {
          bVar1 = Move::isValid((Move *)0x1e5b19);
          in_stack_ffffffffffffff30 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
          if (!bVar1) {
            local_1 = false;
            goto LAB_001e5bba;
          }
        }
        dVar5 = GameTimeController::moveTimeConsumed(in_RDI);
        *(undefined4 *)((long)in_RDI[2].timeLeft + 0xc) = 0;
        std::
        function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
        ::operator()((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                      *)in_RDI,MVar6._0_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(MVar6.promotion,uVar8),MVar7._0_8_,
                     (double)CONCAT44(MVar7.promotion,in_stack_ffffffffffffff30),
                     (EngineComputingState)((ulong)dVar5 >> 0x20));
        local_1 = true;
      }
LAB_001e5bba:
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::~function((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                   *)0x1e5bc7);
      return local_1;
    }
  }
  return false;
}

Assistant:

bool WbEngine::engineMove(const std::string& moveString, bool mustSend)
{
    if (moveString.length() < 2 || !isalpha(moveString.at(0))
        || computingState != EngineComputingState::thinking) { // some engines don't orbey 'force' and create moves too fast -> ignore some cases
        return false;
    }
    
    auto timeCtrl = timeController;
    auto moveRecv = moveReceiver;
    if (timeCtrl == nullptr || moveRecv == nullptr) {
        return false;
    }
    
    auto move = board->moveFromCoordiateString(moveString);
    if (!move.isValid()) {
        move = board->fromSanString(moveString);
    }
    
    if (mustSend || move.isValid()) {
        auto period = timeCtrl->moveTimeConsumed(); // moveTimeConsumed();
        
        auto oldComputingState = computingState;
        computingState = EngineComputingState::idle;
        
        (moveRecv)(move, moveString, Move::illegalMove, period, oldComputingState);
        
        return true;
    }
    
    return false;
}